

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizes
          (UninterpretedOption *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption_NamePart *value;
  uint64 value_00;
  int64 value_01;
  char *pcVar3;
  string *psVar4;
  UnknownFieldSet *pUVar5;
  double value_02;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  UninterpretedOption *this_local;
  
  for (local_1c = 0; iVar2 = name_size(this), local_1c < iVar2; local_1c = local_1c + 1) {
    value = name(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value,output);
  }
  bVar1 = has_identifier_value(this);
  if (bVar1) {
    identifier_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    identifier_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = identifier_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(3,psVar4,output);
  }
  bVar1 = has_positive_int_value(this);
  if (bVar1) {
    value_00 = positive_int_value(this);
    internal::WireFormatLite::WriteUInt64(4,value_00,output);
  }
  bVar1 = has_negative_int_value(this);
  if (bVar1) {
    value_01 = negative_int_value(this);
    internal::WireFormatLite::WriteInt64(5,value_01,output);
  }
  bVar1 = has_double_value(this);
  if (bVar1) {
    value_02 = double_value(this);
    internal::WireFormatLite::WriteDouble(6,value_02,output);
  }
  bVar1 = has_string_value(this);
  if (bVar1) {
    psVar4 = string_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteBytes(7,psVar4,output);
  }
  bVar1 = has_aggregate_value(this);
  if (bVar1) {
    aggregate_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    aggregate_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = aggregate_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(8,psVar4,output);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar5,output);
  }
  return;
}

Assistant:

void UninterpretedOption::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (int i = 0; i < this->name_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->name(i), output);
  }

  // optional string identifier_value = 3;
  if (has_identifier_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->identifier_value(), output);
  }

  // optional uint64 positive_int_value = 4;
  if (has_positive_int_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(4, this->positive_int_value(), output);
  }

  // optional int64 negative_int_value = 5;
  if (has_negative_int_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(5, this->negative_int_value(), output);
  }

  // optional double double_value = 6;
  if (has_double_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(6, this->double_value(), output);
  }

  // optional bytes string_value = 7;
  if (has_string_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteBytes(
      7, this->string_value(), output);
  }

  // optional string aggregate_value = 8;
  if (has_aggregate_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      8, this->aggregate_value(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}